

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pMVar3;
  Vector<float,_3> *pVVar4;
  float *pfVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  Vector<float,_3> *pVVar9;
  long lVar10;
  int col;
  long lVar11;
  int iVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Mat3 shrinkScaleMat;
  long local_a0;
  undefined8 local_7c;
  undefined8 uStack_74;
  Matrix<float,_3,_3> local_58;
  
  pVVar4 = (Vector<float,_3> *)&local_58;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  pfVar5 = makeSafeLods::shrinkScaleMatData;
  lVar8 = 0;
  do {
    lVar11 = 0;
    pVVar9 = pVVar4;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar9->m_data)->m_data[0].m_data[0] = pfVar5[lVar11];
      lVar11 = lVar11 + 1;
      pVVar9 = pVVar9 + 1;
    } while (lVar11 != 3);
    lVar8 = lVar8 + 1;
    pfVar5 = pfVar5 + 3;
    pVVar4 = (Vector<float,_3> *)(pVVar4->m_data + 1);
  } while (lVar8 != 3);
  if (*(int *)&(this->super_ShaderProgram).field_0x154 < 1) {
    return;
  }
  fVar18 = 1.0 / (float)viewportSize->m_data[0];
  fVar15 = 1.0 / (float)viewportSize->m_data[1];
  local_a0 = 0;
  lVar8 = 0;
  do {
    while( true ) {
      pVVar1 = (textureSizes->
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar16 = (float)pVVar1[lVar8].m_data[0];
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar19 = pVVar2[lVar8].m_data[0] * fVar16 * fVar18;
      fVar17 = fVar16 * pVVar2[lVar8].m_data[1] * fVar15;
      fVar16 = (float)pVVar1[lVar8].m_data[1];
      fVar20 = pVVar2[lVar8].m_data[2] * fVar16 * fVar18;
      fVar14 = fVar16 * pVVar2[lVar8].m_data[3] * fVar15;
      fVar16 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar16 = fVar19;
      }
      fVar19 = -fVar17;
      if (-fVar17 <= fVar17) {
        fVar19 = fVar17;
      }
      fVar17 = -fVar20;
      if (-fVar20 <= fVar20) {
        fVar17 = fVar20;
      }
      fVar20 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar20 = fVar14;
      }
      fVar14 = logf((float)(~-(uint)(fVar20 <= fVar17) & (uint)fVar20 |
                           (uint)fVar17 & -(uint)(fVar20 <= fVar17)) +
                    (float)(~-(uint)(fVar19 <= fVar16) & (uint)fVar19 |
                           (uint)fVar16 & -(uint)(fVar19 <= fVar16)));
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1 = (textureSizes->
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar17 = (float)pVVar1[lVar8].m_data[0];
      fVar14 = fVar14 * 1.442695;
      fVar16 = (float)pVVar1[lVar8].m_data[1];
      fVar20 = pVVar2[lVar8].m_data[0] * fVar17 * fVar18;
      fVar19 = fVar17 * pVVar2[lVar8].m_data[1] * fVar15;
      fVar21 = pVVar2[lVar8].m_data[2] * fVar16 * fVar18;
      fVar17 = fVar16 * pVVar2[lVar8].m_data[3] * fVar15;
      fVar16 = -fVar20;
      if (-fVar20 <= fVar20) {
        fVar16 = fVar20;
      }
      fVar20 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar20 = fVar19;
      }
      fVar19 = (float)(~-(uint)(fVar20 <= fVar16) & (uint)fVar20 |
                      (uint)fVar16 & -(uint)(fVar20 <= fVar16));
      fVar16 = -fVar21;
      if (-fVar21 <= fVar21) {
        fVar16 = fVar21;
      }
      fVar20 = -fVar17;
      if (-fVar17 <= fVar17) {
        fVar20 = fVar17;
      }
      fVar16 = (float)(~-(uint)(fVar20 <= fVar16) & (uint)fVar20 |
                      (uint)fVar16 & -(uint)(fVar20 <= fVar16));
      uVar13 = -(uint)(fVar16 <= fVar19);
      fVar16 = logf((float)(~uVar13 & (uint)fVar16 | uVar13 & (uint)fVar19));
      iVar12 = 0;
      iVar7 = 0;
      if (0.5 <= fVar14 + 0.01) {
        fVar17 = ceilf(fVar14 + 0.01 + 0.5);
        iVar7 = (int)fVar17 + -1;
      }
      fVar16 = fVar16 * 1.442695;
      if (0.5 <= fVar16 + -0.01) {
        fVar17 = ceilf(fVar16 + -0.01 + 0.5);
        iVar12 = (int)fVar17 + -1;
      }
      fVar17 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar17 = fVar14;
      }
      if (0.1 <= fVar17) break;
LAB_00f796d9:
      pfVar5 = (float *)&local_7c;
      tcu::operator*((Matrix<float,_3,_3> *)pfVar5,&local_58,
                     (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar8);
      pMVar3 = (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)(pMVar3->m_data).m_data[0].m_data + local_a0;
      lVar6 = 0;
      do {
        lVar10 = 0;
        do {
          *(undefined4 *)(lVar11 + lVar10) = *(undefined4 *)((long)pfVar5 + lVar10);
          lVar10 = lVar10 + 0xc;
        } while (lVar10 != 0x24);
        lVar6 = lVar6 + 1;
        lVar11 = lVar11 + 4;
        pfVar5 = pfVar5 + 1;
      } while (lVar6 != 3);
      calculateLodDerivateParts((Functional *)&local_7c,pMVar3 + lVar8);
      pVVar2 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar8;
      *(undefined8 *)pVVar2->m_data = local_7c;
      *(undefined8 *)(pVVar2->m_data + 2) = uStack_74;
    }
    if (0.0 < fVar14) {
      fVar17 = floorf(fVar14);
      fVar17 = (fVar14 - fVar17) + -0.5;
      fVar14 = -fVar17;
      if (-fVar17 <= fVar17) {
        fVar14 = fVar17;
      }
      if (fVar14 < 0.1) goto LAB_00f796d9;
    }
    fVar14 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar14 = fVar16;
    }
    if (fVar14 < 0.1) goto LAB_00f796d9;
    if (0.0 < fVar16) {
      fVar14 = floorf(fVar16);
      fVar14 = (fVar16 - fVar14) + -0.5;
      fVar16 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar16 = fVar14;
      }
      if (fVar16 < 0.1) goto LAB_00f796d9;
    }
    if (iVar7 != iVar12) goto LAB_00f796d9;
    lVar8 = lVar8 + 1;
    local_a0 = local_a0 + 0x24;
    if (*(int *)&(this->super_ShaderProgram).field_0x154 <= lVar8) {
      return;
    }
  } while( true );
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec2>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMatData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	Mat3 shrinkScaleMat(shrinkScaleMatData);

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = shrinkScaleMat * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}